

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int i;
  size_t __n;
  long lVar5;
  int nOut;
  Fts3MultiSegReader *pFVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  int nNew;
  char *aNew;
  TermSelect tsc;
  Fts3SegFilter filter;
  int local_140;
  int local_13c;
  Fts3MultiSegReader *local_138;
  Fts3Table *local_130;
  char *local_128;
  char **local_120;
  int *local_118;
  Fts3PhraseToken *local_110;
  char *local_108 [16];
  int local_88 [16];
  Fts3SegFilter local_48;
  
  pFVar6 = pTok->pSegcsr;
  local_120 = ppOut;
  local_118 = pnOut;
  memset(local_108,0,0xc0);
  local_48.flags =
       (uint)(pTok->bFirst != 0) * 0x20 + (uint)(pTok->isPrefix != 0) * 8 + 3 +
       (uint)(iColumn < p->nColumn) * 4;
  local_48.zTerm = pTok->z;
  local_48.nTerm = pTok->n;
  pFVar6->pFilter = &local_48;
  local_130 = p;
  local_110 = pTok;
  local_48.iCol = iColumn;
  iVar2 = fts3SegReaderStart(p,pFVar6,local_48.zTerm,local_48.nTerm);
  local_138 = pFVar6;
  while ((iVar2 == 0 && (iVar2 = sqlite3Fts3SegReaderStep(local_130,pFVar6), iVar2 == 100))) {
    pcVar7 = pFVar6->aDoclist;
    iVar2 = pFVar6->nDoclist;
    if (local_108[0] == (char *)0x0) {
      pcVar4 = (char *)sqlite3_malloc(iVar2 + 0xb);
      local_108[0] = pcVar4;
      local_88[0] = iVar2;
      if (pcVar4 != (char *)0x0) {
        __n = (size_t)iVar2;
        memcpy(pcVar4,pcVar7,__n);
        pcVar7 = pcVar4 + __n;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        (pcVar4 + __n + 8)[0] = '\0';
        (pcVar4 + __n + 8)[1] = '\0';
        goto LAB_001bddba;
      }
      iVar2 = 7;
    }
    else {
      pcVar4 = pcVar7;
      lVar5 = 0;
      while (local_108[lVar5] != (char *)0x0) {
        iVar3 = fts3DoclistOrMerge((uint)local_130->bDescIdx,pcVar4,iVar2,local_108[lVar5],
                                   local_88[lVar5],&local_128,&local_140);
        bVar8 = iVar3 == 0;
        if (bVar8) {
          if (pcVar4 != pcVar7) {
            sqlite3_free(pcVar4);
          }
          sqlite3_free(local_108[lVar5]);
          local_108[lVar5] = (char *)0x0;
          pcVar4 = local_128;
          iVar2 = local_140;
          iVar1 = local_13c;
          if (lVar5 == 0xf) {
            local_108[0xf] = local_128;
            local_88[0xf] = local_140;
          }
        }
        else {
          iVar1 = iVar3;
          if (pcVar4 != pcVar7) {
            sqlite3_free(pcVar4);
          }
        }
        local_13c = iVar1;
        if ((iVar3 != 0) || (bVar9 = lVar5 == 0xf, lVar5 = lVar5 + 1, bVar9)) goto LAB_001bddab;
      }
      local_108[lVar5] = pcVar4;
      local_88[lVar5] = iVar2;
      bVar8 = true;
LAB_001bddab:
      pFVar6 = local_138;
      iVar2 = local_13c;
      if (bVar8) {
LAB_001bddba:
        iVar2 = 0;
      }
    }
  }
  if (iVar2 == 0) {
    lVar5 = 0;
    iVar2 = 0;
    pcVar7 = (char *)0x0;
    do {
      pcVar4 = local_108[lVar5];
      if (pcVar4 != (char *)0x0) {
        if (pcVar7 == (char *)0x0) {
          iVar2 = local_88[lVar5];
          local_108[lVar5] = (char *)0x0;
          pcVar7 = pcVar4;
        }
        else {
          iVar2 = fts3DoclistOrMerge((uint)local_130->bDescIdx,pcVar4,local_88[lVar5],pcVar7,iVar2,
                                     &local_128,&local_140);
          if (iVar2 != 0) {
            sqlite3_free(pcVar7);
            goto LAB_001bde9c;
          }
          sqlite3_free(local_108[lVar5]);
          sqlite3_free(pcVar7);
          local_108[lVar5] = (char *)0x0;
          pcVar7 = local_128;
          iVar2 = local_140;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    local_108[0] = pcVar7;
    local_88[0] = iVar2;
    iVar2 = 0;
  }
LAB_001bde9c:
  pFVar6 = local_138;
  if (iVar2 == 0) {
    *local_120 = local_108[0];
    *local_118 = local_88[0];
  }
  else {
    lVar5 = 0;
    do {
      sqlite3_free(local_108[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
  }
  sqlite3Fts3SegReaderFinish(pFVar6);
  sqlite3_free(pFVar6);
  local_110->pSegcsr = (Fts3MultiSegReader *)0x0;
  return iVar2;
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr)) 
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}